

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::render
          (FramebufferClearCase *this,GLuint program)

{
  glUniform4fvFunc p_Var1;
  Functions *gl_00;
  int iVar2;
  GLint GVar3;
  undefined4 extraout_var;
  bool local_8a;
  bool local_89;
  Vector<float,_3> local_78;
  Vector<float,_3> local_6c;
  bool local_5e;
  bool local_5d;
  GLfloat local_5c;
  bool useStencil;
  GLint GStack_58;
  bool useDepth;
  float clearDepth;
  int clearStencil;
  Color clearColor;
  ChannelOrder local_38;
  undefined1 local_30 [8];
  BufferFmtDesc bufferFmt;
  Functions *gl;
  GLuint program_local;
  FramebufferClearCase *this_local;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  register0x00000000 = (Functions *)CONCAT44(extraout_var,iVar2);
  join_0x00000010_0x00000000_ = getBufferFormat(this->m_clearType);
  bufferFmt.texFmt.order = local_38;
  local_30 = (undefined1  [8])clearColor.field_1._8_8_;
  getMainColor((Color *)&clearDepth,(BufferFmtDesc *)local_30);
  GStack_58 = 0x7b;
  local_5c = 0.5;
  switch(this->m_clearType) {
  case CLEAR_COLOR_FIXED:
    (*stack0xffffffffffffffe0->clearBufferfv)(0x1800,0,(GLfloat *)&clearStencil);
    break;
  case CLEAR_COLOR_FLOAT:
    (*stack0xffffffffffffffe0->clearBufferfv)(0x1800,0,(GLfloat *)&clearStencil);
    break;
  case CLEAR_COLOR_INT:
    (*stack0xffffffffffffffe0->clearBufferiv)(0x1800,0,&clearStencil);
    break;
  case CLEAR_COLOR_UINT:
    (*stack0xffffffffffffffe0->clearBufferuiv)(0x1800,0,(GLuint *)&clearStencil);
    break;
  case CLEAR_DEPTH:
    (*stack0xffffffffffffffe0->clearBufferfv)(0x1801,0,&local_5c);
    break;
  case CLEAR_STENCIL:
    (*stack0xffffffffffffffe0->clearBufferiv)(0x1802,0,&stack0xffffffffffffffa8);
    break;
  case CLEAR_DEPTH_STENCIL:
    (*stack0xffffffffffffffe0->clearBufferfi)(0x84f9,0,0.5,0x7b);
  }
  local_89 = true;
  if (this->m_clearType != CLEAR_DEPTH) {
    local_89 = this->m_clearType == CLEAR_DEPTH_STENCIL;
  }
  local_5d = local_89;
  local_8a = true;
  if (this->m_clearType != CLEAR_STENCIL) {
    local_8a = this->m_clearType == CLEAR_DEPTH_STENCIL;
  }
  local_5e = local_8a;
  if ((local_89 != false) || (local_8a != false)) {
    if (local_89 != false) {
      (*stack0xffffffffffffffe0->enable)(0xb71);
    }
    if ((local_5e & 1U) != 0) {
      (*stack0xffffffffffffffe0->enable)(0xb90);
    }
    (*stack0xffffffffffffffe0->stencilFunc)(0x202,0x7b,0xffffffff);
    (*stack0xffffffffffffffe0->depthFunc)(0x204);
    (*stack0xffffffffffffffe0->disable)(0xc11);
    p_Var1 = stack0xffffffffffffffe0->uniform4fv;
    GVar3 = (*stack0xffffffffffffffe0->getUniformLocation)(program,"u_color");
    (*p_Var1)(GVar3,1,(GLfloat *)&clearStencil);
    gl_00 = stack0xffffffffffffffe0;
    tcu::Vector<float,_3>::Vector(&local_6c,-1.0,-1.0,0.6);
    tcu::Vector<float,_3>::Vector(&local_78,1.0,1.0,0.6);
    drawQuad(gl_00,program,&local_6c,&local_78);
  }
  return;
}

Assistant:

void FramebufferClearCase::render (GLuint program) const
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const BufferFmtDesc		bufferFmt			= getBufferFormat(m_clearType);
	const Color				clearColor			= getMainColor(bufferFmt);

	const int				clearStencil		= 123;
	const float				clearDepth			= 0.5f;

	switch (m_clearType)
	{
		case CLEAR_COLOR_FIXED:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_FLOAT:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_INT:		gl.clearBufferiv (GL_COLOR, 0, clearColor.i);						break;
		case CLEAR_COLOR_UINT:		gl.clearBufferuiv(GL_COLOR, 0, clearColor.u);						break;
		case CLEAR_DEPTH:			gl.clearBufferfv (GL_DEPTH, 0, &clearDepth);						break;
		case CLEAR_STENCIL:			gl.clearBufferiv (GL_STENCIL, 0, &clearStencil);					break;
		case CLEAR_DEPTH_STENCIL:	gl.clearBufferfi (GL_DEPTH_STENCIL, 0, clearDepth, clearStencil);	break;

		default:
			DE_ASSERT(false);
	}

	const bool useDepth		= (m_clearType == CLEAR_DEPTH   || m_clearType == CLEAR_DEPTH_STENCIL);
	const bool useStencil	= (m_clearType == CLEAR_STENCIL || m_clearType == CLEAR_DEPTH_STENCIL);

	// Render something to expose changes to depth/stencil buffer
	if (useDepth || useStencil)
	{
		if (useDepth)
			gl.enable(GL_DEPTH_TEST);

		if (useStencil)
			gl.enable(GL_STENCIL_TEST);

		gl.stencilFunc(GL_EQUAL, clearStencil, ~0u);
		gl.depthFunc(GL_GREATER);
		gl.disable(GL_SCISSOR_TEST);

		gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, clearColor.f);
		drawQuad(gl, program, tcu::Vec3(-1.0f, -1.0f, 0.6f), tcu::Vec3(1.0f, 1.0f, 0.6f));
	}
}